

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

string * __thiscall
pbrt::MeasuredBxDF::ToString_abi_cxx11_(string *__return_storage_ptr__,MeasuredBxDF *this)

{
  MeasuredBRDF *v;
  
  v = this->brdf;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::MeasuredBRDF_const&>
            (__return_storage_ptr__,"[ MeasuredBxDF brdf: %s ]",v);
  return __return_storage_ptr__;
}

Assistant:

std::string MeasuredBxDF::ToString() const {
    return StringPrintf("[ MeasuredBxDF brdf: %s ]", *brdf);
}